

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::BlobShape::InternalSwap(BlobShape *this,BlobShape *other)

{
  uint32 uVar1;
  int iVar2;
  void *pvVar3;
  UnknownFieldSet *other_00;
  
  google::protobuf::RepeatedField<long>::InternalSwap(&this->dim_,&other->dim_);
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pvVar3 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar3 & 1) == 0) goto LAB_004863a7;
LAB_0048639a:
    other_00 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar3 & 1) != 0) goto LAB_0048639a;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_004863a7:
  iVar2 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar2;
  return;
}

Assistant:

void BlobShape::InternalSwap(BlobShape* other) {
  dim_.InternalSwap(&other->dim_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}